

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void __thiscall
fmt::v7::vprint<char[33],char>
          (v7 *this,FILE *f,text_style *ts,char (*format) [33],
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          args)

{
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args_00;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buf;
  char local_239;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_238;
  
  local_238.super_buffer<char>.ptr_ = local_238.store_;
  local_238.super_buffer<char>.size_ = 0;
  local_238.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_0073a4b8;
  local_238.super_buffer<char>.capacity_ = 500;
  format_str = to_string_view<char,_0>((char *)ts);
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
        )(anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
          )args.desc_;
  args_00.desc_ = (unsigned_long_long)format;
  detail::vformat_to<char>(&local_238.super_buffer<char>,(text_style *)f,format_str,args_00);
  local_239 = '\0';
  detail::buffer<char>::push_back(&local_238.super_buffer<char>,&local_239);
  fputs(local_238.super_buffer<char>.ptr_,(FILE *)this);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&local_238);
  return;
}

Assistant:

void vprint(std::FILE* f, const text_style& ts, const S& format,
            basic_format_args<buffer_context<type_identity_t<Char>>> args) {
  basic_memory_buffer<Char> buf;
  detail::vformat_to(buf, ts, to_string_view(format), args);
  buf.push_back(Char(0));
  detail::fputs(buf.data(), f);
}